

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::remove_index
          (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this,int index)

{
  long lVar1;
  int iVar2;
  
  iVar2 = this->num_elements;
  if (index + 1 < iVar2) {
    lVar1 = (long)index;
    do {
      this->list[lVar1] = this->list[lVar1 + 1];
      lVar1 = lVar1 + 1;
    } while (iVar2 + -1 != (int)lVar1);
  }
  iVar2 = iVar2 + -1;
  if (this->list_size < iVar2) {
    alloc(this,iVar2);
  }
  this->num_elements = iVar2;
  return;
}

Assistant:

void remove_index(int index)
	{
		for(int i = index+1; i < num_elements; i++)
			list[i-1] = list[i];

		set_size(size()-1);
	}